

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::ParsedScene::Film(ParsedScene *this,string *type,ParsedParameterVector params,FileLoc loc)

{
  FileLoc loc_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary dict;
  SceneEntity local_1f8;
  ParameterDictionary local_158;
  ParameterDictionary local_f0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_88;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_88,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_f0,&local_88,(this->graphicsState).colorSpace);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_88);
  if (this->currentBlock != WorldBlock) {
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_158.params,&local_f0.params);
    local_158.colorSpace = local_f0.colorSpace;
    loc_00.filename._M_str = (char *)params.ptr;
    loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
    loc_00._16_8_ = params.field_2.fixed[0];
    SceneEntity::SceneEntity(&local_1f8,type,&local_158,loc_00);
    std::__cxx11::string::operator=((string *)&this->film,(string *)&local_1f8);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::operator=(&(this->film).parameters.params,&local_1f8.parameters.params);
    (this->film).parameters.colorSpace = local_1f8.parameters.colorSpace;
    (this->film).loc.filename._M_len = local_1f8.loc.filename._M_len;
    (this->film).loc.filename._M_str = local_1f8.loc.filename._M_str;
    (this->film).loc.line = local_1f8.loc.line;
    (this->film).loc.column = local_1f8.loc.column;
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_1f8.parameters.params);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
      operator_delete(local_1f8.name._M_dataplus._M_p,
                      local_1f8.name.field_2._M_allocated_capacity + 1);
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_158.params);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_f0.params);
    return;
  }
  ErrorExit<char_const(&)[5]>
            ((FileLoc *)&params,"Options cannot be set inside world block; \"%s\" is not allowed.",
             (char (*) [5])"Film");
}

Assistant:

void ParsedScene::Film(const std::string &type, ParsedParameterVector params,
                       FileLoc loc) {
    ParameterDictionary dict(std::move(params), graphicsState.colorSpace);
    VERIFY_OPTIONS("Film");
    film = SceneEntity(type, std::move(dict), loc);
}